

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Solver::set_long_option(Solver *this,char *arg)

{
  bool bVar1;
  undefined8 extraout_RAX;
  char *in_RCX;
  pointer unaff_R15;
  int val;
  string name;
  int local_44;
  string local_40;
  
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::set_long_option(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    set_long_option();
LAB_0083c57d:
    set_long_option();
  }
  else {
    if (this->internal == (Internal *)0x0) goto LAB_0083c57d;
    if ((this->_state & VALID) != 0) {
      if (this->_state == CONFIGURING) {
        if ((*arg == '-') && (arg[1] == '-')) {
          local_40._M_string_length = 0;
          local_40.field_2._M_local_buf[0] = '\0';
          local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
          bVar1 = Options::parse_long_option(arg,&local_40,&local_44);
          if (bVar1) {
            set(this,local_40._M_dataplus._M_p,local_44);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,
                            CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                                     local_40.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          bVar1 = false;
        }
        return bVar1;
      }
      goto LAB_0083c587;
    }
  }
  set_long_option();
LAB_0083c587:
  set_long_option((Solver *)arg);
  if (local_40._M_dataplus._M_p != unaff_R15) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool Solver::set_long_option (const char *arg) {
  LOG_API_CALL_BEGIN ("set", arg);
  REQUIRE_VALID_STATE ();
  REQUIRE (state () == CONFIGURING,
           "can only set option '%s' right after initialization", arg);
  bool res;
  if (arg[0] != '-' || arg[1] != '-')
    res = false;
  else {
    int val;
    string name;
    res = Options::parse_long_option (arg, name, val);
    if (res)
      set (name.c_str (), val);
  }
  LOG_API_CALL_END ("set", arg, res);
  return res;
}